

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O1

void __thiscall xray_re::_lzhuf::StartHuff(_lzhuf *this)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    this->freq[lVar2] = 1;
    this->son[lVar2] = (int)lVar2 + 0x273;
    this->prnt[lVar2 + 0x273] = (int)lVar2;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x13a);
  iVar1 = 0x13a;
  lVar2 = 0;
  do {
    *(uint *)((long)this->freq + lVar2 * 2 + 0x4e8) = this->freq[lVar2 + 1] + this->freq[lVar2];
    *(int *)((long)this->son + lVar2 * 2 + 0x4e8) = (int)lVar2;
    this->prnt[lVar2 + 1] = iVar1;
    this->prnt[lVar2] = iVar1;
    lVar2 = lVar2 + 2;
    iVar1 = iVar1 + 1;
  } while (lVar2 != 0x272);
  this->freq[0x273] = 0xffff;
  this->prnt[0x272] = 0;
  return;
}

Assistant:

void _lzhuf::StartHuff(void)
{
	int i, j;

	for (i = 0; i < N_CHAR; i++) {
		freq[i] = 1;
		son[i] = i + T;
		prnt[i + T] = i;
	}
	i = 0; j = N_CHAR;
	while (j <= R) {
		freq[j] = freq[i] + freq[i + 1];
		son[j] = i;
		prnt[i] = prnt[i + 1] = j;
		i += 2; j++;
	}
	freq[T] = 0xffff;
	prnt[R] = 0;
}